

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O1

void musig_test_set_secnonce
               (secp256k1_musig_secnonce *secnonce,uchar *secnonce64,secp256k1_pubkey *pubkey)

{
  int iVar1;
  secp256k1_scalar k [2];
  secp256k1_ge pk;
  secp256k1_scalar sStack_b8;
  secp256k1_scalar local_98;
  secp256k1_ge local_70;
  
  secp256k1_scalar_set_b32(&sStack_b8,secnonce64,(int *)0x0);
  secp256k1_scalar_set_b32(&local_98,secnonce64 + 0x20,(int *)0x0);
  iVar1 = secp256k1_pubkey_load(CTX,&local_70,pubkey);
  if (iVar1 != 0) {
    secp256k1_musig_secnonce_save(secnonce,&sStack_b8,&local_70);
    return;
  }
  musig_test_set_secnonce_cold_1();
  return;
}

Assistant:

static void musig_test_set_secnonce(secp256k1_musig_secnonce *secnonce, const unsigned char *secnonce64, const secp256k1_pubkey *pubkey) {
    secp256k1_ge pk;
    secp256k1_scalar k[2];

    secp256k1_scalar_set_b32(&k[0], &secnonce64[0], NULL);
    secp256k1_scalar_set_b32(&k[1], &secnonce64[32], NULL);
    CHECK(secp256k1_pubkey_load(CTX, &pk, pubkey));
    secp256k1_musig_secnonce_save(secnonce, k, &pk);
}